

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void CodeSpectralEnvelope
               (double **spectrogram,int f0_length,int fs,int fft_size,int number_of_dimensions,
               double **coded_spectral_envelope)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  double *mel_axis_00;
  double *frequency_axis_00;
  double *log_spectral_envelope;
  double dVar6;
  int local_b0;
  int local_ac;
  int j;
  int i;
  ForwardRealFFT forward_real_fft;
  fft_complex *weight;
  double *tmp_spectrum;
  double *frequency_axis;
  double *mel_axis;
  double **coded_spectral_envelope_local;
  int number_of_dimensions_local;
  int fft_size_local;
  int fs_local;
  int f0_length_local;
  double **spectrogram_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(fft_size / 2);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  mel_axis_00 = (double *)operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(fft_size / 2 + 1);
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  frequency_axis_00 = (double *)operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(fft_size / 2 + 1);
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  log_spectral_envelope = (double *)operator_new__(uVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(fft_size / 2);
  uVar5 = SUB168(auVar4 * ZEXT816(0x10),0);
  if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  forward_real_fft.forward_fft.w = (double *)operator_new__(uVar5);
  dVar6 = MyMinDouble((double)fs / 2.0,20000.0);
  anon_unknown.dwarf_20c0::GetParametersForCoding
            (40.0,dVar6,fs,fft_size,mel_axis_00,frequency_axis_00,
             (fft_complex *)forward_real_fft.forward_fft.w);
  memset(&j,0,0x60);
  InitializeForwardRealFFT(fft_size / 2,(ForwardRealFFT *)&j);
  for (local_ac = 0; local_ac < f0_length; local_ac = local_ac + 1) {
    for (local_b0 = 0; local_b0 < fft_size / 2 + 1; local_b0 = local_b0 + 1) {
      dVar6 = log(spectrogram[local_ac][local_b0]);
      log_spectral_envelope[local_b0] = dVar6;
    }
    anon_unknown.dwarf_20c0::CodeOneFrame
              (log_spectral_envelope,frequency_axis_00,fft_size,mel_axis_00,
               (fft_complex *)forward_real_fft.forward_fft.w,fft_size / 2,number_of_dimensions,
               (ForwardRealFFT *)&j,coded_spectral_envelope[local_ac]);
  }
  DestroyForwardRealFFT((ForwardRealFFT *)&j);
  if (forward_real_fft.forward_fft.w != (double *)0x0) {
    operator_delete__(forward_real_fft.forward_fft.w);
  }
  if (log_spectral_envelope != (double *)0x0) {
    operator_delete__(log_spectral_envelope);
  }
  if (frequency_axis_00 != (double *)0x0) {
    operator_delete__(frequency_axis_00);
  }
  if (mel_axis_00 != (double *)0x0) {
    operator_delete__(mel_axis_00);
  }
  return;
}

Assistant:

void CodeSpectralEnvelope(const double * const *spectrogram, int f0_length,
    int fs, int fft_size, int number_of_dimensions,
    double **coded_spectral_envelope) {
  double *mel_axis = new double[fft_size / 2];
  double *frequency_axis = new double[fft_size / 2 + 1];
  double *tmp_spectrum = new double[fft_size / 2 + 1];
  fft_complex *weight = new fft_complex[fft_size / 2];

  // Generation of the required parameters
  GetParametersForCoding(world::kFloorFrequency,
      MyMinDouble(fs / 2.0, world::kCeilFrequency), fs, fft_size,
      mel_axis, frequency_axis, weight);

  ForwardRealFFT forward_real_fft = { 0 };
  InitializeForwardRealFFT(fft_size / 2, &forward_real_fft);

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      tmp_spectrum[j] = log(spectrogram[i][j]);
    CodeOneFrame(tmp_spectrum, frequency_axis, fft_size, mel_axis, weight,
        fft_size / 2, number_of_dimensions, &forward_real_fft,
        coded_spectral_envelope[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] weight;
  delete[] tmp_spectrum;
  delete[] frequency_axis;
  delete[] mel_axis;
}